

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::InputScalarEx
               (char *label,ImGuiDataType data_type,void *data_ptr,void *step_ptr,
               void *step_fast_ptr,char *scalar_format,ImGuiInputTextFlags extra_flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  float fVar3;
  ImGuiWindow *pIVar4;
  iterator initial_value_buf;
  float fVar5;
  void *local_108;
  void *local_f0;
  ImVec2 local_c4;
  byte local_b9;
  char local_b8 [7];
  bool value_changed;
  char buf [64];
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 button_sz;
  ImVec2 label_size;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  char *scalar_format_local;
  void *step_fast_ptr_local;
  void *step_ptr_local;
  void *data_ptr_local;
  ImGuiDataType data_type_local;
  char *label_local;
  
  pIVar4 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar4->SkipItems & 1U) == 0) {
    button_sz = CalcTextSize(label,(char *)0x0,true,-1.0);
    BeginGroup();
    PushID(label);
    ImVec2::ImVec2(&local_70,pIVar1->FontSize,pIVar1->FontSize);
    buf._56_8_ = ::operator*(&(pIVar1->Style).FramePadding,2.0);
    local_68 = ::operator+(&local_70,(ImVec2 *)(buf + 0x38));
    if (step_ptr != (void *)0x0) {
      fVar5 = CalcItemWidth();
      fVar3 = -(local_68.x + (pIVar1->Style).ItemInnerSpacing.x);
      fVar3 = ImMax(1.0,fVar3 + fVar3 + fVar5);
      PushItemWidth(fVar3);
    }
    DataTypeFormatString(data_type,data_ptr,scalar_format,local_b8,0x40);
    local_b9 = 0;
    if ((extra_flags & 2U) == 0) {
      extra_flags = extra_flags | 1;
    }
    bVar2 = InputText("",local_b8,0x40,extra_flags | 0x10,(ImGuiTextEditCallback)0x0,(void *)0x0);
    if (bVar2) {
      initial_value_buf = ImVector<char>::begin(&(GImGui->InputTextState).InitialText);
      local_b9 = DataTypeApplyOpFromText
                           (local_b8,initial_value_buf,data_type,data_ptr,scalar_format);
    }
    if (step_ptr != (void *)0x0) {
      PopItemWidth();
      SameLine(0.0,(pIVar1->Style).ItemInnerSpacing.x);
      bVar2 = ButtonEx("-",&local_68,0x41);
      if (bVar2) {
        local_f0 = step_ptr;
        if ((((pIVar1->IO).KeyCtrl & 1U) != 0) && (step_fast_ptr != (void *)0x0)) {
          local_f0 = step_fast_ptr;
        }
        DataTypeApplyOp(data_type,0x2d,data_ptr,local_f0);
        local_b9 = 1;
      }
      SameLine(0.0,(pIVar1->Style).ItemInnerSpacing.x);
      bVar2 = ButtonEx("+",&local_68,0x41);
      if (bVar2) {
        local_108 = step_ptr;
        if ((((pIVar1->IO).KeyCtrl & 1U) != 0) && (step_fast_ptr != (void *)0x0)) {
          local_108 = step_fast_ptr;
        }
        DataTypeApplyOp(data_type,0x2b,data_ptr,local_108);
        local_b9 = 1;
      }
    }
    PopID();
    if (0.0 < button_sz.x) {
      SameLine(0.0,(pIVar1->Style).ItemInnerSpacing.x);
      ImVec2::ImVec2(&local_c4,(pIVar4->DC).CursorPos.x,
                     (pIVar4->DC).CursorPos.y + (pIVar1->Style).FramePadding.y);
      RenderText(local_c4,label,(char *)0x0,true);
      ItemSize(&button_sz,(pIVar1->Style).FramePadding.y);
    }
    EndGroup();
    label_local._7_1_ = (bool)(local_b9 & 1);
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::InputScalarEx(const char* label, ImGuiDataType data_type, void* data_ptr, void* step_ptr, void* step_fast_ptr, const char* scalar_format, ImGuiInputTextFlags extra_flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    BeginGroup();
    PushID(label);
    const ImVec2 button_sz = ImVec2(g.FontSize, g.FontSize) + style.FramePadding*2.0f;
    if (step_ptr)
        PushItemWidth(ImMax(1.0f, CalcItemWidth() - (button_sz.x + style.ItemInnerSpacing.x)*2));

    char buf[64];
    DataTypeFormatString(data_type, data_ptr, scalar_format, buf, IM_ARRAYSIZE(buf));

    bool value_changed = false;
    if (!(extra_flags & ImGuiInputTextFlags_CharsHexadecimal))
        extra_flags |= ImGuiInputTextFlags_CharsDecimal;
    extra_flags |= ImGuiInputTextFlags_AutoSelectAll;
    if (InputText("", buf, IM_ARRAYSIZE(buf), extra_flags)) // PushId(label) + "" gives us the expected ID from outside point of view
        value_changed = DataTypeApplyOpFromText(buf, GImGui->InputTextState.InitialText.begin(), data_type, data_ptr, scalar_format);

    // Step buttons
    if (step_ptr)
    {
        PopItemWidth();
        SameLine(0, style.ItemInnerSpacing.x);
        if (ButtonEx("-", button_sz, ImGuiButtonFlags_Repeat | ImGuiButtonFlags_DontClosePopups))
        {
            DataTypeApplyOp(data_type, '-', data_ptr, g.IO.KeyCtrl && step_fast_ptr ? step_fast_ptr : step_ptr);
            value_changed = true;
        }
        SameLine(0, style.ItemInnerSpacing.x);
        if (ButtonEx("+", button_sz, ImGuiButtonFlags_Repeat | ImGuiButtonFlags_DontClosePopups))
        {
            DataTypeApplyOp(data_type, '+', data_ptr, g.IO.KeyCtrl && step_fast_ptr ? step_fast_ptr : step_ptr);
            value_changed = true;
        }
    }
    PopID();

    if (label_size.x > 0)
    {
        SameLine(0, style.ItemInnerSpacing.x);
        RenderText(ImVec2(window->DC.CursorPos.x, window->DC.CursorPos.y + style.FramePadding.y), label);
        ItemSize(label_size, style.FramePadding.y);
    }
    EndGroup();

    return value_changed;
}